

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O3

exr_result_t
exr_read_deep_chunk(exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
                   void *packed_data,void *sample_data)

{
  long lVar1;
  ulong uVar2;
  exr_result_t eVar3;
  int iVar4;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar5;
  char *pcVar6;
  undefined8 uVar7;
  int64_t nread;
  uint64_t dataoffset;
  undefined8 local_28;
  uint64_t local_20;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar3 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar3;
    }
    if (cinfo != (exr_chunk_info_t *)0x0) {
      lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      iVar4 = cinfo->idx;
      if ((iVar4 < 0) || (*(int *)(lVar1 + 0xf4) <= iVar4)) {
        eVar3 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"invalid chunk index (%d) vs part chunk count %d",iVar4,
                           *(int *)(lVar1 + 0xf4),*(code **)(ctxt + 0x48));
        return eVar3;
      }
      if (cinfo->type == *(uint8_t *)(lVar1 + 4)) {
        if (cinfo->compression == *(uint8_t *)(lVar1 + 0xb0)) {
          uVar2 = *(ulong *)(ctxt + 0x98);
          if ((long)uVar2 < 1) {
LAB_00121b6e:
            if ((sample_data != (void *)0x0) && (cinfo->sample_count_table_size != 0)) {
              local_20 = cinfo->sample_count_data_offset;
              local_28 = 0;
              iVar4 = (**(code **)(ctxt + 0x28))
                                (ctxt,sample_data,cinfo->sample_count_table_size,&local_20,&local_28
                                 ,0);
              if (iVar4 != 0) {
                return iVar4;
              }
            }
            if (packed_data == (void *)0x0) {
              return 0;
            }
            if (cinfo->packed_size == 0) {
              return 0;
            }
            local_20 = cinfo->data_offset;
            local_28 = 0;
            eVar3 = (**(code **)(ctxt + 0x28))(ctxt,packed_data);
            return eVar3;
          }
          uVar5 = cinfo->sample_count_data_offset;
          if (uVar2 < uVar5) {
            UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
            pcVar6 = "chunk block info sample count offset (%lu) past end of file (%ld)";
          }
          else {
            uVar5 = cinfo->data_offset;
            if (uVar5 <= uVar2) goto LAB_00121b6e;
            UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
            pcVar6 = "chunk block info data offset (%lu) past end of file (%ld)";
          }
          eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar6,uVar5,uVar2,UNRECOVERED_JUMPTABLE);
          return eVar3;
        }
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
        pcVar6 = "mismatched compression type for chunk block info";
      }
      else {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
        pcVar6 = "mismatched storage type for chunk block info";
      }
      eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar6);
      return eVar3;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar7 = 3;
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar7 = 7;
  }
  eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar7);
  return eVar3;
}

Assistant:

exr_result_t
exr_read_deep_chunk (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    void*                   packed_data,
    void*                   sample_data)
{
    exr_result_t                 rv;
    uint64_t                     dataoffset, toread;
    int64_t                      nread;
    enum _INTERNAL_EXR_READ_MODE rmode = EXR_MUST_READ_ALL;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!cinfo) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    if (cinfo->idx < 0 || cinfo->idx >= part->chunk_count)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "invalid chunk index (%d) vs part chunk count %d",
            cinfo->idx,
            part->chunk_count);
    if (cinfo->type != (uint8_t) part->storage_mode)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "mismatched storage type for chunk block info");
    if (cinfo->compression != (uint8_t) part->comp_type)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "mismatched compression type for chunk block info");

    if (pctxt->file_size > 0 &&
        cinfo->sample_count_data_offset > (uint64_t) pctxt->file_size)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "chunk block info sample count offset (%" PRIu64
            ") past end of file (%" PRId64 ")",
            cinfo->sample_count_data_offset,
            pctxt->file_size);

    if (pctxt->file_size > 0 &&
        cinfo->data_offset > (uint64_t) pctxt->file_size)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "chunk block info data offset (%" PRIu64
            ") past end of file (%" PRId64 ")",
            cinfo->data_offset,
            pctxt->file_size);

    rv = EXR_ERR_SUCCESS;
    if (sample_data && cinfo->sample_count_table_size > 0)
    {
        dataoffset = cinfo->sample_count_data_offset;
        toread     = cinfo->sample_count_table_size;
        nread      = 0;
        rv         = pctxt->do_read (
            pctxt, sample_data, toread, &dataoffset, &nread, rmode);
    }

    if (rv != EXR_ERR_SUCCESS) return rv;

    if (packed_data && cinfo->packed_size > 0)
    {
        dataoffset = cinfo->data_offset;
        toread     = cinfo->packed_size;
        nread      = 0;
        rv         = pctxt->do_read (
            pctxt, packed_data, toread, &dataoffset, &nread, rmode);
    }

    return rv;
}